

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O2

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,BlankLine *param_1)

{
  bool bVar1;
  
  bVar1 = isLastLineEmpty(this);
  if (!bVar1) {
    bVar1 = isLastLineActive(this);
    if (bVar1) {
      startNewLine(this);
    }
    startNewLine(this);
  }
  return this;
}

Assistant:

inline CodePrinter& CodePrinter::operator<< (const BlankLine&)         { if (! isLastLineEmpty()) { if (isLastLineActive()) startNewLine(); startNewLine(); } return *this; }